

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

void __thiscall Assembler::processJumpMemDir(Assembler *this,string *instruction,string *operand)

{
  bool bVar1;
  string local_a0;
  string local_80;
  string local_50;
  int local_2c;
  int local_28;
  int value;
  int adr;
  int reg;
  string *operand_local;
  string *instruction_local;
  Assembler *this_local;
  
  value = 0xff;
  local_28 = 4;
  _adr = operand;
  operand_local = instruction;
  instruction_local = &this->inputFileName;
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (operand,&symbolReg_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_50,(string *)operand);
    local_2c = processAbsoluteAddressingSymbol(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::__cxx11::string::string((string *)&local_80,(string *)operand);
    local_2c = literalToDecimal(this,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::__cxx11::string::string((string *)&local_a0,(string *)instruction);
  instr5Bytes(this,&local_a0,value,local_28,local_2c);
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void Assembler::processJumpMemDir(string instruction, string operand) {
    int reg = 0xFF;
    int adr = 0x04;
    int value;
    if (regex_match(operand, symbolReg)) value = processAbsoluteAddressingSymbol(operand);
    else value = literalToDecimal(operand);

    instr5Bytes(instruction, reg, adr, value);

}